

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

Qiniu_Error
Qiniu_Client_callWithBody
          (Qiniu_Client *self,Qiniu_Json **ret,char *url,char *body,Qiniu_Int64 bodyLen,
          char *mimeType,char *md5)

{
  CURL *curl;
  Qiniu_Json **ppQVar1;
  uint uVar2;
  char *__ptr;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  Qiniu_Error QVar6;
  undefined8 local_e8;
  Qiniu_Json **local_e0;
  char *local_d8;
  char *local_d0;
  Qiniu_Header **local_c8;
  char *local_c0;
  char userAgent [64];
  char ctxLength [64];
  
  curl = self->curl;
  pcVar5 = mimeType;
  local_d8 = (char *)bodyLen;
  local_c8 = (Qiniu_Header **)url;
  local_c0 = body;
  QVar6 = Qiniu_Client_config(self);
  if (QVar6.code == 200) {
    curl_easy_setopt(curl,0x2f,1);
    local_e0 = ret;
    local_d0 = mimeType;
    if (mimeType == (char *)0x0) {
      __ptr = "Content-Type: application/octet-stream";
    }
    else {
      __ptr = Qiniu_String_Concat2("Content-Type: ",mimeType);
    }
    snprintf(ctxLength,0x40,"Content-Length: %lld",local_d8);
    snprintf(userAgent,0x40,"UserAgent: QiniuC/%s");
    uVar3 = curl_slist_append(0,ctxLength);
    uVar3 = curl_slist_append(uVar3,__ptr);
    uVar3 = curl_slist_append(uVar3,userAgent);
    uVar3 = curl_slist_append(uVar3,"Expect:");
    if (md5 != (char *)0x0) {
      local_e8 = uVar3;
      pcVar4 = Qiniu_String_Concat2("Content-MD5: ",md5);
      uVar3 = curl_slist_append(uVar3,pcVar4);
    }
    ppQVar1 = local_e0;
    local_e8 = uVar3;
    if ((self->auth).itbl != (Qiniu_Auth_Itbl *)0x0) {
      pcVar4 = local_d8;
      if (local_c0 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      QVar6 = Qiniu_Do_Auth(self,(char *)&local_e8,local_c8,local_c0,pcVar4,(size_t)pcVar5);
      if (QVar6.code != 200) goto LAB_0011fad6;
    }
    curl_easy_setopt(curl,0x2727,local_e8);
    QVar6 = Qiniu_callex(curl,&self->b,&self->root,0,&self->respHeader);
    pcVar5 = QVar6.message;
    uVar2 = QVar6.code;
    curl_slist_free_all(local_e8);
    if (local_d0 != (char *)0x0) {
      free(__ptr);
    }
    *ppQVar1 = self->root;
  }
  else {
LAB_0011fad6:
    pcVar5 = QVar6.message;
    uVar2 = QVar6.code;
  }
  QVar6._4_4_ = 0;
  QVar6.code = uVar2;
  QVar6.message = pcVar5;
  return QVar6;
}

Assistant:

static Qiniu_Error Qiniu_Client_callWithBody(
    Qiniu_Client *self, Qiniu_Json **ret, const char *url,
    const char *body, Qiniu_Int64 bodyLen, const char *mimeType, const char *md5)
{
    int retCode = 0;
    Qiniu_Error err;
    const char *ctxType;
    char ctxLength[64], userAgent[64];
    Qiniu_Header *headers;
    CURL *curl = (CURL *)self->curl;
    err = Qiniu_Client_config(self);
    if (err.code != 200)
    {
        return err;
    }

    curl_easy_setopt(curl, CURLOPT_POST, 1);

    if (mimeType == NULL)
    {
        ctxType = "Content-Type: application/octet-stream";
    }
    else
    {
        ctxType = Qiniu_String_Concat2("Content-Type: ", mimeType);
    }

    Qiniu_snprintf(ctxLength, 64, "Content-Length: %lld", bodyLen);
    Qiniu_snprintf(userAgent, 64, "UserAgent: QiniuC/%s", version);
    headers = curl_slist_append(NULL, ctxLength);
    headers = curl_slist_append(headers, ctxType);
    headers = curl_slist_append(headers, userAgent);
    headers = curl_slist_append(headers, "Expect:");
    if (md5 != NULL)
    {
        char *contentMd5 = Qiniu_String_Concat2("Content-MD5: ", md5);
        headers = curl_slist_append(headers, contentMd5);
    }

    if (self->auth.itbl != NULL)
    {
        if (body == NULL)
        {
            bodyLen = 0;
        }
        err = Qiniu_Do_Auth(self, "POST", &headers, url, body, (size_t)bodyLen);
        if (err.code != 200)
        {
            return err;
        }
    }

    curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

    err = Qiniu_callex(curl, &self->b, &self->root, Qiniu_False, &self->respHeader);

    curl_slist_free_all(headers);
    if (mimeType != NULL)
    {
        free((void *)ctxType);
    }

    *ret = self->root;
    return err;
}